

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

void __thiscall
persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::compute_higher_persistence
          (persistence_computer_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this,unsigned_short min_dimension,unsigned_short max_dimension)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  pair<int,_int> pVar6;
  undefined6 in_register_00000012;
  int iVar7;
  undefined6 in_register_00000032;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int dimension;
  value_t vVar11;
  allocator_type local_a9;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  pivot_column_index_t pivot_column_index;
  
  local_98 = CONCAT62(in_register_00000012,max_dimension) & 0xffffffff;
  uVar10 = CONCAT62(in_register_00000032,min_dimension) & 0xffffffff;
  local_a8 = (ulong)((int)CONCAT62(in_register_00000032,min_dimension) - 1);
  local_88 = local_98 + 1;
  uVar2 = 1;
  local_90 = uVar10;
  do {
    do {
      uVar4 = uVar2;
      if (uVar4 == local_88) {
        return;
      }
      dimension = (int)uVar4;
      directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
      prepare_next_dimension(this->complex,dimension);
      local_a0 = uVar4 + 1;
      if (local_a0 == uVar10) {
        uVar1 = (uint)(this->complex->cell_count).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar4];
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        lVar8 = 0;
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          vVar11 = directed_flag_complex_in_memory_computer::
                   directed_flag_complex_in_memory_computer_t::filtration
                             (this->complex,dimension,(index_t)uVar10);
          pivot_column_index.super__Deque_base<int,_std::allocator<int>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)((ulong)(uint)vVar11 + lVar8);
          std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
          emplace_back<filtration_index_t>
                    (&this->columns_to_reduce,(filtration_index_t *)&pivot_column_index);
          lVar8 = lVar8 + 0x100000000;
        }
      }
      uVar10 = local_90;
      uVar2 = local_a0;
    } while (local_a0 < local_90);
    (*this->output->_vptr_output_t[5])(this->output,uVar4 & 0xffff);
    sort_columns(this);
    poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar5 = std::operator<<(poVar5,"computing persistent homology in dimension ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::operator<<(poVar5,"\r");
    std::deque<int,_std::allocator<int>_>::deque
              (&pivot_column_index,
               (this->complex->cell_count).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4 + 1],&INVALID_INDEX,&local_a9);
    pVar6 = compute_pairs(this,dimension,&pivot_column_index,uVar10 <= uVar4);
    iVar9 = pVar6.second;
    if (uVar4 < uVar10) {
      if (((uVar4 == local_a8) && (this->print_betti_numbers_to_console == true)) &&
         (this->max_entries != 0xffffffffffffffff)) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar5 = std::operator<<(poVar5,"# Skipped columns in dimension ");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5,": ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
        goto LAB_00145db9;
      }
    }
    else {
      iVar7 = pVar6.first;
      (*this->output->_vptr_output_t[9])(this->output,(long)iVar7,(long)pVar6 >> 0x20);
      iVar3 = -iVar7;
      if ((uVar4 & 1) == 0) {
        iVar3 = iVar7;
      }
      this->euler_characteristic = this->euler_characteristic + iVar3;
      if (this->print_betti_numbers_to_console == true) {
        poVar5 = std::operator<<((ostream *)&std::cout,"\x1b[K");
        poVar5 = std::operator<<(poVar5,"dim H_");
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        poVar5 = std::operator<<(poVar5," = ");
        std::ostream::operator<<(poVar5,iVar7);
        poVar5 = (ostream *)&std::cout;
        if (iVar9 != 0 && -1 < (long)pVar6) {
          poVar5 = std::operator<<((ostream *)&std::cout," (skipped ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar9);
          std::operator<<(poVar5,")");
          poVar5 = (ostream *)&std::cout;
        }
LAB_00145db9:
        std::endl<char,std::char_traits<char>>(poVar5);
      }
    }
    if (uVar4 < local_98) {
      assemble_columns_to_reduce(this,dimension,&pivot_column_index);
    }
    if (this->complex->_is_top_dimension == true) {
      (*this->output->_vptr_output_t[10])();
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                (&pivot_column_index.super__Deque_base<int,_std::allocator<int>_>);
      return;
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              (&pivot_column_index.super__Deque_base<int,_std::allocator<int>_>);
    uVar2 = local_a0;
  } while( true );
}

Assistant:

void compute_higher_persistence(unsigned short min_dimension, unsigned short max_dimension) {
		for (auto dimension = 1u; dimension <= max_dimension; ++dimension) {
			complex.prepare_next_dimension(dimension);

			if (dimension + 1 == min_dimension) {
				// Here we need to reduce *all* cells because we did not compute anything of smaller dimension
				index_t number_of_cells = index_t(complex.number_of_cells(dimension));
				for (index_t index = 0; index < number_of_cells; index++) {
					columns_to_reduce.push_back(std::make_pair(complex.filtration(dimension, index), index));
				}
			}

			if (dimension + 1 < min_dimension) continue;

			output->computing_barcodes_in_dimension(dimension);

			sort_columns();

#ifdef INDICATE_PROGRESS
			std::cout << "\033[K"
			          << "computing persistent homology in dimension " << dimension << std::flush << "\r";
#endif
#ifdef USE_ARRAY_HASHMAP
			pivot_column_index_t pivot_column_index(complex.number_of_cells(dimension + 1), INVALID_INDEX);
#else
			pivot_column_index_t pivot_column_index;
			pivot_column_index.reserve(complex.number_of_cells(dimension + 1));
#endif

			auto betti = compute_pairs(dimension, pivot_column_index, dimension >= min_dimension);
			if (dimension >= min_dimension) {
				complex.computation_result(dimension, betti.first, betti.second);
#ifdef RETRIEVE_PERSISTENCE
				betti_numbers.push_back(betti.first);
#endif
				output->betti_number(betti.first, betti.second);
				euler_characteristic += (dimension & 1 ? -1 : 1) * betti.first;

				if (print_betti_numbers_to_console) {
					std::cout << "\033[K"
					          << "dim H_" << dimension << " = " << betti.first;
					if (betti.second > 0) { std::cout << " (skipped " << betti.second << ")"; }
					std::cout << std::endl;
				}
			} else if (int(dimension) == min_dimension - 1 && print_betti_numbers_to_console &&
			           max_entries < std::numeric_limits<size_t>::max()) {
				std::cout << "\033[K"
				          << "# Skipped columns in dimension " << dimension << ": " << betti.second << std::endl;
			}
			if (dimension < max_dimension) assemble_columns_to_reduce(dimension, pivot_column_index);

			// Stop early
			if (complex.is_top_dimension()) {
				output->remaining_homology_is_trivial();
				break;
			}
		}
	}